

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_cache_unknown_chunk(png_structrp png_ptr,png_uint_32 length)

{
  png_byte *ppVar1;
  ulong local_28;
  png_alloc_size_t limit;
  png_uint_32 length_local;
  png_structrp png_ptr_local;
  
  local_28 = 0xffffffffffffffff;
  if ((png_ptr->unknown_chunk).data != (png_byte *)0x0) {
    png_free(png_ptr,(png_ptr->unknown_chunk).data);
    (png_ptr->unknown_chunk).data = (png_byte *)0x0;
  }
  if ((png_ptr->user_chunk_malloc_max != 0) &&
     (png_ptr->user_chunk_malloc_max != 0xffffffffffffffff)) {
    local_28 = png_ptr->user_chunk_malloc_max;
  }
  if (length <= local_28) {
    (png_ptr->unknown_chunk).name[0] = (png_byte)(png_ptr->chunk_name >> 0x18);
    (png_ptr->unknown_chunk).name[1] = (png_byte)(png_ptr->chunk_name >> 0x10);
    (png_ptr->unknown_chunk).name[2] = (png_byte)(png_ptr->chunk_name >> 8);
    (png_ptr->unknown_chunk).name[3] = (png_byte)png_ptr->chunk_name;
    (png_ptr->unknown_chunk).name[4] = '\0';
    (png_ptr->unknown_chunk).size = (ulong)length;
    (png_ptr->unknown_chunk).location = (png_byte)png_ptr->mode;
    if (length == 0) {
      (png_ptr->unknown_chunk).data = (png_byte *)0x0;
    }
    else {
      ppVar1 = (png_byte *)png_malloc_warn(png_ptr,(ulong)length);
      (png_ptr->unknown_chunk).data = ppVar1;
    }
  }
  if (((png_ptr->unknown_chunk).data == (png_byte *)0x0) && (length != 0)) {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"unknown chunk exceeds memory limits");
    png_ptr_local._4_4_ = 0;
  }
  else {
    if (length != 0) {
      png_crc_read(png_ptr,(png_ptr->unknown_chunk).data,length);
    }
    png_crc_finish(png_ptr,0);
    png_ptr_local._4_4_ = 1;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
png_cache_unknown_chunk(png_structrp png_ptr, png_uint_32 length)
{
   png_alloc_size_t limit = PNG_SIZE_MAX;

   if (png_ptr->unknown_chunk.data != NULL)
   {
      png_free(png_ptr, png_ptr->unknown_chunk.data);
      png_ptr->unknown_chunk.data = NULL;
   }

#  ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;

#  elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
#  endif

   if (length <= limit)
   {
      PNG_CSTRING_FROM_CHUNK(png_ptr->unknown_chunk.name, png_ptr->chunk_name);
      /* The following is safe because of the PNG_SIZE_MAX init above */
      png_ptr->unknown_chunk.size = (png_size_t)length/*SAFE*/;
      /* 'mode' is a flag array, only the bottom four bits matter here */
      png_ptr->unknown_chunk.location = (png_byte)png_ptr->mode/*SAFE*/;

      if (length == 0)
         png_ptr->unknown_chunk.data = NULL;

      else
      {
         /* Do a 'warn' here - it is handled below. */
         png_ptr->unknown_chunk.data = png_voidcast(png_bytep,
             png_malloc_warn(png_ptr, length));
      }
   }

   if (png_ptr->unknown_chunk.data == NULL && length > 0)
   {
      /* This is benign because we clean up correctly */
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "unknown chunk exceeds memory limits");
      return 0;
   }

   else
   {
      if (length > 0)
         png_crc_read(png_ptr, png_ptr->unknown_chunk.data, length);
      png_crc_finish(png_ptr, 0);
      return 1;
   }
}